

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha3.c
# Opt level: O3

int sha3_shake_init(hash_state *md,int num)

{
  int iVar1;
  
  if (md == (hash_state *)0x0) {
    sha3_shake_init_cold_1();
  }
  if ((num == 0x100) || (iVar1 = 0x10, num == 0x80)) {
    iVar1 = 0;
    *(char *)((long)md + 0x160) = '\0';
    *(char *)((long)md + 0x161) = '\0';
    *(char *)((long)md + 0x162) = '\0';
    *(char *)((long)md + 0x163) = '\0';
    *(char *)((long)md + 0x164) = '\0';
    *(char *)((long)md + 0x165) = '\0';
    *(char *)((long)md + 0x166) = '\0';
    *(char *)((long)md + 0x167) = '\0';
    *(char *)((long)md + 0x168) = '\0';
    *(char *)((long)md + 0x169) = '\0';
    *(char *)((long)md + 0x16a) = '\0';
    *(char *)((long)md + 0x16b) = '\0';
    *(char *)((long)md + 0x16c) = '\0';
    *(char *)((long)md + 0x16d) = '\0';
    *(char *)((long)md + 0x16e) = '\0';
    *(char *)((long)md + 0x16f) = '\0';
    *(char *)((long)md + 0x170) = '\0';
    *(char *)((long)md + 0x171) = '\0';
    *(char *)((long)md + 0x172) = '\0';
    *(char *)((long)md + 0x173) = '\0';
    *(char *)((long)md + 0x174) = '\0';
    *(char *)((long)md + 0x175) = '\0';
    *(char *)((long)md + 0x176) = '\0';
    *(char *)((long)md + 0x177) = '\0';
    *(char *)((long)md + 0x178) = '\0';
    *(char *)((long)md + 0x179) = '\0';
    *(char *)((long)md + 0x17a) = '\0';
    *(char *)((long)md + 0x17b) = '\0';
    *(char *)((long)md + 0x17c) = '\0';
    *(char *)((long)md + 0x17d) = '\0';
    *(char *)((long)md + 0x17e) = '\0';
    *(char *)((long)md + 0x17f) = '\0';
    *(char *)((long)md + 0x180) = '\0';
    *(char *)((long)md + 0x181) = '\0';
    *(char *)((long)md + 0x182) = '\0';
    *(char *)((long)md + 0x183) = '\0';
    *(char *)((long)md + 0x184) = '\0';
    *(char *)((long)md + 0x185) = '\0';
    *(char *)((long)md + 0x186) = '\0';
    *(char *)((long)md + 0x187) = '\0';
    *(char *)((long)md + 0x188) = '\0';
    *(char *)((long)md + 0x189) = '\0';
    *(char *)((long)md + 0x18a) = '\0';
    *(char *)((long)md + 0x18b) = '\0';
    *(char *)((long)md + 0x18c) = '\0';
    *(char *)((long)md + 0x18d) = '\0';
    *(char *)((long)md + 0x18e) = '\0';
    *(char *)((long)md + 399) = '\0';
    *(char *)((long)md + 400) = '\0';
    *(char *)((long)md + 0x191) = '\0';
    *(char *)((long)md + 0x192) = '\0';
    *(char *)((long)md + 0x193) = '\0';
    *(char *)((long)md + 0x194) = '\0';
    *(char *)((long)md + 0x195) = '\0';
    *(char *)((long)md + 0x196) = '\0';
    *(char *)((long)md + 0x197) = '\0';
    *(char *)((long)md + 0x198) = '\0';
    *(char *)((long)md + 0x199) = '\0';
    *(char *)((long)md + 0x19a) = '\0';
    *(char *)((long)md + 0x19b) = '\0';
    *(char *)((long)md + 0x19c) = '\0';
    *(char *)((long)md + 0x19d) = '\0';
    *(char *)((long)md + 0x19e) = '\0';
    *(char *)((long)md + 0x19f) = '\0';
    *(char *)((long)md + 0x140) = '\0';
    *(char *)((long)md + 0x141) = '\0';
    *(char *)((long)md + 0x142) = '\0';
    *(char *)((long)md + 0x143) = '\0';
    *(char *)((long)md + 0x144) = '\0';
    *(char *)((long)md + 0x145) = '\0';
    *(char *)((long)md + 0x146) = '\0';
    *(char *)((long)md + 0x147) = '\0';
    *(char *)((long)md + 0x148) = '\0';
    *(char *)((long)md + 0x149) = '\0';
    *(char *)((long)md + 0x14a) = '\0';
    *(char *)((long)md + 0x14b) = '\0';
    *(char *)((long)md + 0x14c) = '\0';
    *(char *)((long)md + 0x14d) = '\0';
    *(char *)((long)md + 0x14e) = '\0';
    *(char *)((long)md + 0x14f) = '\0';
    *(char *)((long)md + 0x150) = '\0';
    *(char *)((long)md + 0x151) = '\0';
    *(char *)((long)md + 0x152) = '\0';
    *(char *)((long)md + 0x153) = '\0';
    *(char *)((long)md + 0x154) = '\0';
    *(char *)((long)md + 0x155) = '\0';
    *(char *)((long)md + 0x156) = '\0';
    *(char *)((long)md + 0x157) = '\0';
    *(char *)((long)md + 0x158) = '\0';
    *(char *)((long)md + 0x159) = '\0';
    *(char *)((long)md + 0x15a) = '\0';
    *(char *)((long)md + 0x15b) = '\0';
    *(char *)((long)md + 0x15c) = '\0';
    *(char *)((long)md + 0x15d) = '\0';
    *(char *)((long)md + 0x15e) = '\0';
    *(char *)((long)md + 0x15f) = '\0';
    *(char *)((long)md + 0x160) = '\0';
    *(char *)((long)md + 0x161) = '\0';
    *(char *)((long)md + 0x162) = '\0';
    *(char *)((long)md + 0x163) = '\0';
    *(char *)((long)md + 0x164) = '\0';
    *(char *)((long)md + 0x165) = '\0';
    *(char *)((long)md + 0x166) = '\0';
    *(char *)((long)md + 0x167) = '\0';
    *(char *)((long)md + 0x168) = '\0';
    *(char *)((long)md + 0x169) = '\0';
    *(char *)((long)md + 0x16a) = '\0';
    *(char *)((long)md + 0x16b) = '\0';
    *(char *)((long)md + 0x16c) = '\0';
    *(char *)((long)md + 0x16d) = '\0';
    *(char *)((long)md + 0x16e) = '\0';
    *(char *)((long)md + 0x16f) = '\0';
    *(char *)((long)md + 0x170) = '\0';
    *(char *)((long)md + 0x171) = '\0';
    *(char *)((long)md + 0x172) = '\0';
    *(char *)((long)md + 0x173) = '\0';
    *(char *)((long)md + 0x174) = '\0';
    *(char *)((long)md + 0x175) = '\0';
    *(char *)((long)md + 0x176) = '\0';
    *(char *)((long)md + 0x177) = '\0';
    *(char *)((long)md + 0x178) = '\0';
    *(char *)((long)md + 0x179) = '\0';
    *(char *)((long)md + 0x17a) = '\0';
    *(char *)((long)md + 0x17b) = '\0';
    *(char *)((long)md + 0x17c) = '\0';
    *(char *)((long)md + 0x17d) = '\0';
    *(char *)((long)md + 0x17e) = '\0';
    *(char *)((long)md + 0x17f) = '\0';
    *(char *)((long)md + 0x100) = '\0';
    *(char *)((long)md + 0x101) = '\0';
    *(char *)((long)md + 0x102) = '\0';
    *(char *)((long)md + 0x103) = '\0';
    *(char *)((long)md + 0x104) = '\0';
    *(char *)((long)md + 0x105) = '\0';
    *(char *)((long)md + 0x106) = '\0';
    *(char *)((long)md + 0x107) = '\0';
    *(char *)((long)md + 0x108) = '\0';
    *(char *)((long)md + 0x109) = '\0';
    *(char *)((long)md + 0x10a) = '\0';
    *(char *)((long)md + 0x10b) = '\0';
    *(char *)((long)md + 0x10c) = '\0';
    *(char *)((long)md + 0x10d) = '\0';
    *(char *)((long)md + 0x10e) = '\0';
    *(char *)((long)md + 0x10f) = '\0';
    *(char *)((long)md + 0x110) = '\0';
    *(char *)((long)md + 0x111) = '\0';
    *(char *)((long)md + 0x112) = '\0';
    *(char *)((long)md + 0x113) = '\0';
    *(char *)((long)md + 0x114) = '\0';
    *(char *)((long)md + 0x115) = '\0';
    *(char *)((long)md + 0x116) = '\0';
    *(char *)((long)md + 0x117) = '\0';
    *(char *)((long)md + 0x118) = '\0';
    *(char *)((long)md + 0x119) = '\0';
    *(char *)((long)md + 0x11a) = '\0';
    *(char *)((long)md + 0x11b) = '\0';
    *(char *)((long)md + 0x11c) = '\0';
    *(char *)((long)md + 0x11d) = '\0';
    *(char *)((long)md + 0x11e) = '\0';
    *(char *)((long)md + 0x11f) = '\0';
    *(char *)((long)md + 0x120) = '\0';
    *(char *)((long)md + 0x121) = '\0';
    *(char *)((long)md + 0x122) = '\0';
    *(char *)((long)md + 0x123) = '\0';
    *(char *)((long)md + 0x124) = '\0';
    *(char *)((long)md + 0x125) = '\0';
    *(char *)((long)md + 0x126) = '\0';
    *(char *)((long)md + 0x127) = '\0';
    *(char *)((long)md + 0x128) = '\0';
    *(char *)((long)md + 0x129) = '\0';
    *(char *)((long)md + 0x12a) = '\0';
    *(char *)((long)md + 299) = '\0';
    *(char *)((long)md + 300) = '\0';
    *(char *)((long)md + 0x12d) = '\0';
    *(char *)((long)md + 0x12e) = '\0';
    *(char *)((long)md + 0x12f) = '\0';
    *(char *)((long)md + 0x130) = '\0';
    *(char *)((long)md + 0x131) = '\0';
    *(char *)((long)md + 0x132) = '\0';
    *(char *)((long)md + 0x133) = '\0';
    *(char *)((long)md + 0x134) = '\0';
    *(char *)((long)md + 0x135) = '\0';
    *(char *)((long)md + 0x136) = '\0';
    *(char *)((long)md + 0x137) = '\0';
    *(char *)((long)md + 0x138) = '\0';
    *(char *)((long)md + 0x139) = '\0';
    *(char *)((long)md + 0x13a) = '\0';
    *(char *)((long)md + 0x13b) = '\0';
    *(char *)((long)md + 0x13c) = '\0';
    *(char *)((long)md + 0x13d) = '\0';
    *(char *)((long)md + 0x13e) = '\0';
    *(char *)((long)md + 0x13f) = '\0';
    (md->sha3).s[0x17] = 0;
    (md->sha3).s[0x18] = 0;
    *(char *)((long)md + 0xd0) = '\0';
    *(char *)((long)md + 0xd1) = '\0';
    *(char *)((long)md + 0xd2) = '\0';
    *(char *)((long)md + 0xd3) = '\0';
    *(char *)((long)md + 0xd4) = '\0';
    *(char *)((long)md + 0xd5) = '\0';
    *(char *)((long)md + 0xd6) = '\0';
    *(char *)((long)md + 0xd7) = '\0';
    *(char *)((long)md + 0xd8) = '\0';
    *(char *)((long)md + 0xd9) = '\0';
    *(char *)((long)md + 0xda) = '\0';
    *(char *)((long)md + 0xdb) = '\0';
    *(char *)((long)md + 0xdc) = '\0';
    *(char *)((long)md + 0xdd) = '\0';
    *(char *)((long)md + 0xde) = '\0';
    *(char *)((long)md + 0xdf) = '\0';
    (md->blake2b).curlen = 0;
    (md->blake2b).outlen = 0;
    *(char *)((long)md + 0xf0) = '\0';
    *(char *)((long)md + 0xf1) = '\0';
    *(char *)((long)md + 0xf2) = '\0';
    *(char *)((long)md + 0xf3) = '\0';
    *(char *)((long)md + 0xf4) = '\0';
    *(char *)((long)md + 0xf5) = '\0';
    *(char *)((long)md + 0xf6) = '\0';
    *(char *)((long)md + 0xf7) = '\0';
    *(char *)((long)md + 0xf8) = '\0';
    *(char *)((long)md + 0xf9) = '\0';
    *(char *)((long)md + 0xfa) = '\0';
    *(char *)((long)md + 0xfb) = '\0';
    *(char *)((long)md + 0xfc) = '\0';
    *(char *)((long)md + 0xfd) = '\0';
    *(char *)((long)md + 0xfe) = '\0';
    *(char *)((long)md + 0xff) = '\0';
    (md->sha3).s[0xf] = 0;
    (md->sha3).s[0x10] = 0;
    (md->sha3).s[0x11] = 0;
    (md->sha3).s[0x12] = 0;
    (md->sha3).s[0x13] = 0;
    (md->sha3).s[0x14] = 0;
    (md->sha3).s[0x15] = 0;
    (md->sha3).s[0x16] = 0;
    (md->whirlpool).state[7] = 0;
    (md->sha3).s[8] = 0;
    (md->sha3).s[9] = 0;
    (md->sha3).s[10] = 0;
    (md->sha3).s[0xb] = 0;
    (md->sha3).s[0xc] = 0;
    (md->sha3).s[0xd] = 0;
    (md->sha3).s[0xe] = 0;
    (md->chc).length = 0;
    (md->whirlpool).state[0] = 0;
    (md->whirlpool).state[1] = 0;
    (md->whirlpool).state[2] = 0;
    (md->whirlpool).state[3] = 0;
    (md->whirlpool).state[4] = 0;
    (md->whirlpool).state[5] = 0;
    (md->whirlpool).state[6] = 0;
    (md->sha3).capacity_words = (unsigned_short)((uint)num >> 5);
  }
  return iVar1;
}

Assistant:

int sha3_shake_init(hash_state *md, int num)
{
   LTC_ARGCHK(md != NULL);
   if (num != 128 && num != 256) return CRYPT_INVALID_ARG;
   XMEMSET(&md->sha3, 0, sizeof(md->sha3));
   md->sha3.capacity_words = (unsigned short)(2 * num / (8 * sizeof(ulong64)));
   return CRYPT_OK;
}